

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void __thiscall
trompeloeil::
call_matcher_list<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::decommission(call_matcher_list<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *this)

{
  list_elem<trompeloeil::call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar1;
  list_elem<trompeloeil::call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar2;
  list_elem<trompeloeil::call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar3;
  list_elem<trompeloeil::call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar4;
  call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *m;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> uStack_28;
  
  get_lock<void>();
  plVar4 = (this->
           super_list<trompeloeil::call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
           ).
           super_list_elem<trompeloeil::call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           .next;
  while (plVar4 != (list_elem<trompeloeil::call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    *)this) {
    plVar1 = plVar4->next;
    (*(((list<trompeloeil::call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::ignore_disposer>
         *)&plVar4->_vptr_list_elem)->
      super_list_elem<trompeloeil::call_matcher_base<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      )._vptr_list_elem[2])(plVar4);
    plVar2 = plVar4->next;
    plVar3 = plVar4->prev;
    plVar2->prev = plVar3;
    plVar3->next = plVar2;
    plVar4->next = plVar4;
    plVar4->prev = plVar4;
    plVar4 = plVar1;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void decommission()
    {
      auto lock = get_lock();
      auto iter = this->begin();
      auto const e = this->end();
      while (iter != e)
      {
        auto &m = *iter;
        ++iter; // intrusive list, so must advance to next before destroying
        m.mock_destroyed();
        m.unlink();
      }
    }